

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O0

longdouble * csv::internals::pow10<unsigned_int>(longdouble *__return_storage_ptr__,uint *n)

{
  undefined4 local_3c;
  uint i;
  longdouble ret;
  longdouble multiplicand;
  uint *n_local;
  
  for (local_3c = 0; local_3c < *(uint *)__return_storage_ptr__; local_3c = local_3c + 1) {
  }
  return (longdouble *)(ulong)local_3c;
}

Assistant:

HEDLEY_CONST CONSTEXPR_14
        long double pow10(const unsigned& n) noexcept {
            long double multiplicand = n > 0 ? 10 : 0.1,
                ret = 1;

            for (unsigned i = 0; i < n; i++) {
                ret *= multiplicand;
            }

            return ret;
        }